

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O1

int cgpr_mt(custom_function *funcpt,custom_gradient *funcgrad,double *xc,int N,double *dx,
           double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,double xtol,
           double *xf)

{
  double *dx_00;
  int iVar1;
  int iVar2;
  double *p;
  double *f;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_0000008c;
  size_t __size;
  uint uVar6;
  double dVar7;
  double dVar8;
  double *__x;
  double local_d8;
  double alpha;
  double *local_c8;
  double *local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  custom_gradient *local_a0;
  size_t local_98;
  int local_8c;
  double *local_88;
  undefined8 local_80;
  double *local_78;
  custom_function *local_70;
  double local_68;
  double local_60;
  double *local_58;
  double local_50;
  double fxf;
  double *local_40;
  double *local_38;
  
  local_80 = CONCAT44(in_register_0000008c,MAXITER);
  alpha = xtol;
  local_b8 = ftol;
  local_b0 = gtol;
  local_a0 = funcgrad;
  local_88 = dx;
  local_70 = funcpt;
  local_60 = eps;
  fxf = maxstep;
  local_38 = xc;
  local_58 = (double *)malloc(0x40);
  __size = (long)N << 3;
  p = (double *)malloc(__size);
  f = (double *)malloc(__size);
  local_78 = (double *)malloc(__size);
  pdVar3 = (double *)malloc(__size);
  *niter = 0;
  if (local_60 < 0.0) {
    local_68 = sqrt(local_60);
  }
  else {
    local_68 = SQRT(local_60);
  }
  dx_00 = local_88;
  local_d8 = 1.0;
  if (0 < N) {
    memcpy(pdVar3,local_38,(ulong)(uint)N << 3);
  }
  dVar7 = 0.0;
  if (fxf <= 0.0) {
    __x = (double *)0x0;
    if (0 < N) {
      uVar5 = 0;
      do {
        dVar8 = dx_00[uVar5];
        dVar7 = dVar7 + dVar8 * dVar8;
        __x = (double *)((double)__x + dVar8 * pdVar3[uVar5] * dVar8 * pdVar3[uVar5]);
        uVar5 = uVar5 + 1;
      } while ((uint)N != uVar5);
    }
    if (dVar7 < 0.0) {
      local_38 = __x;
      fxf = sqrt(dVar7);
      __x = local_38;
    }
    else {
      fxf = SQRT(dVar7);
    }
    if ((double)__x < 0.0) {
      dVar7 = sqrt((double)__x);
    }
    else {
      dVar7 = SQRT((double)__x);
    }
    if (fxf <= dVar7) {
      fxf = dVar7 * 1000.0;
    }
    else {
      fxf = fxf * 1000.0;
    }
  }
  local_40 = pdVar3;
  iVar1 = grad_fd(local_70,local_a0,pdVar3,N,dx_00,local_68,f);
  iVar2 = 0;
  if (iVar1 == 0xf) {
    iVar2 = 0xf;
  }
  if (0 < N) {
    memcpy(xf,local_40,(ulong)(uint)N * 8);
    uVar5 = 0;
    do {
      p[uVar5] = -f[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)N != uVar5);
  }
  pdVar3 = local_40;
  local_50 = (*local_70->funcpt)(local_40,N,local_70->params);
  if (1.79769313486232e+308 <= ABS(local_50)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    iVar2 = 0xf;
  }
  if (NAN(local_50)) {
    printf("Program Exiting as the function returns NaN");
    iVar2 = 0xf;
  }
  if (iVar2 == 0) {
    local_a8 = local_50;
    local_c8 = local_58 + 1;
    local_c0 = local_58 + 3;
    uVar5 = (ulong)(uint)N;
    local_98 = uVar5 * 8;
    local_38 = (double *)0x0;
    do {
      if ((int)local_80 <= *niter) {
LAB_00139c48:
        iVar2 = (uint)((int)local_80 <= *niter) << 2;
        pdVar3 = local_40;
        break;
      }
      *niter = *niter + 1;
      mmult(f,f,local_58,1,N,1);
      if (0 < N) {
        memcpy(local_78,f,local_98);
      }
      iVar2 = lnsrchmt(local_70,local_a0,local_40,&local_50,f,&local_d8,p,N,local_88,fxf,
                       (int)local_80,local_68,local_b8,local_b0,alpha,xf);
      if (iVar2 == 100) {
        printf("The Linesearch Algorithm didn\'t converge");
        goto LAB_00139c48;
      }
      uVar6 = (int)local_38 + 1;
      local_8c = iVar2;
      mmult(f,f,local_c8,1,N,1);
      mmult(local_78,f,local_c0,1,N,1);
      dVar8 = (local_58[1] - local_58[3]) / *local_58;
      dVar7 = 0.0;
      if (0.0 <= dVar8) {
        dVar7 = dVar8;
      }
      local_58[2] = dVar7;
      if (uVar6 == N) {
        local_38 = (double *)0x0;
        if (0 < N) {
          uVar4 = 0;
          do {
            p[uVar4] = -f[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
      }
      else {
        local_38 = (double *)(ulong)uVar6;
        if (0 < N) {
          uVar4 = 0;
          do {
            p[uVar4] = p[uVar4] * dVar7 - f[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
      }
      iVar2 = stopcheck2_mt(local_50,N,local_a8,f,local_88,local_60,local_b0,local_b8,local_8c);
      local_a8 = local_50;
      if (0 < N) {
        memcpy(local_40,xf,local_98);
      }
      pdVar3 = local_40;
    } while (iVar2 == 0);
  }
  free(local_58);
  free(p);
  free(f);
  free(local_78);
  free(pdVar3);
  return iVar2;
}

Assistant:

int cgpr_mt(custom_function *funcpt, custom_gradient *funcgrad, double *xc, int N, double *dx,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf) {
	int i, rcode, retval, k, restart,gfdcode;
	int siter;
	double *xi,*temp, *rk, *pk, *jac, *jacf, *apk;
	double fsval,fxf,eps2,fo;
	double dt1, dt2,alpha;

	temp = (double*)malloc(sizeof(double)* 8);
	rk = (double*)malloc(sizeof(double)*N);
	pk = (double*)malloc(sizeof(double)*N);
	apk = (double*)malloc(sizeof(double)*N);
	jac = (double*)malloc(sizeof(double)*N);
	jacf = (double*)malloc(sizeof(double)*N);
	xi = (double*)malloc(sizeof(double)*N);

	*niter = 0;
	k = 0;
	rcode = 0;
	restart = N;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;

	//xtol = 1.0e-15;
	//ftol = 1e-10;
	//gtol = 1e-05;

	// Values that may not be needed

	fsval = 1.0;
	alpha = 1.0;

	for (i = 0; i < N; ++i) {
		xi[i] = xc[i];
	}
	
	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);
		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}



	gfdcode = grad_fd(funcpt,funcgrad, xi, N, dx,eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	for (i = 0; i < N; ++i) {
		pk[i] = -jac[i];
		xf[i] = xi[i];
	}

	fxf = FUNCPT_EVAL(funcpt,xi, N);

	if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fxf != fxf) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	if (restart < N) {
		restart = N;
	}

	fo = fxf;


	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		k++;

		mmult(jac, jac, temp, 1, N, 1);
		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		retval = lnsrchmt(funcpt,funcgrad, xi,&fxf,jac,&alpha, pk, N, dx, maxstep,MAXITER,eps2, ftol, gtol, xtol, xf);
		if (retval == 100) {
			printf("The Linesearch Algorithm didn't converge");
			break;
		}
		//mdisplay(xf,1,N);
		
		//mdisplay(xf, 1, N);
		//grad_fd(funcpt, xf, N, dx, jacf);
		mmult(jac, jac, temp + 1, 1, N, 1);
		mmult(jacf, jac, temp + 3, 1, N, 1);
		temp[2] = (temp[1] - temp[3]) / temp[0]; // beta

		if (temp[2] < 0) {
			temp[2] = 0;
		}
		if (k == restart) {
			for (i = 0; i < N; ++i) {
				pk[i] = -jac[i];
			}
			k = 0;
		}
		else {
			for (i = 0; i < N; ++i) {
				pk[i] = temp[2] * pk[i] - jac[i];
			}
		}
		

		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		fo = fxf;
		for (i = 0; i < N; ++i) {
			xi[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	free(temp);
	free(rk);
	free(pk);
	free(jac);
	free(apk);
	free(jacf);
	free(xi);

	return rcode;
}